

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseReserved
          (Parser *this,DescriptorProto *message,LocationRecorder *message_location)

{
  bool bVar1;
  Token *pTVar2;
  undefined1 local_a0 [8];
  LocationRecorder location_1;
  LocationRecorder location;
  undefined1 local_60 [8];
  Token start_token;
  LocationRecorder *message_location_local;
  DescriptorProto *message_local;
  Parser *this_local;
  
  start_token._48_8_ = message_location;
  pTVar2 = io::Tokenizer::current(this->input_);
  io::Tokenizer::Token::Token((Token *)local_60,pTVar2);
  bVar1 = Consume(this,"reserved");
  if (bVar1) {
    bVar1 = LookingAtType(this,TYPE_STRING);
    if (bVar1) {
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)&location_1.location_,(LocationRecorder *)start_token._48_8_,10
                );
      LocationRecorder::StartAt((LocationRecorder *)&location_1.location_,(Token *)local_60);
      this_local._7_1_ = ParseReservedNames(this,message,(LocationRecorder *)&location_1.location_);
      LocationRecorder::~LocationRecorder((LocationRecorder *)&location_1.location_);
    }
    else {
      LocationRecorder::LocationRecorder
                ((LocationRecorder *)local_a0,(LocationRecorder *)start_token._48_8_,9);
      LocationRecorder::StartAt((LocationRecorder *)local_a0,(Token *)local_60);
      this_local._7_1_ = ParseReservedNumbers(this,message,(LocationRecorder *)local_a0);
      LocationRecorder::~LocationRecorder((LocationRecorder *)local_a0);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  io::Tokenizer::Token::~Token((Token *)local_60);
  return this_local._7_1_;
}

Assistant:

bool Parser::ParseReserved(DescriptorProto* message,
                           const LocationRecorder& message_location) {
  io::Tokenizer::Token start_token = input_->current();
  // Parse the declaration.
  DO(Consume("reserved"));
  if (LookingAtType(io::Tokenizer::TYPE_STRING)) {
    LocationRecorder location(message_location,
                              DescriptorProto::kReservedNameFieldNumber);
    location.StartAt(start_token);
    return ParseReservedNames(message, location);
  } else {
    LocationRecorder location(message_location,
                              DescriptorProto::kReservedRangeFieldNumber);
    location.StartAt(start_token);
    return ParseReservedNumbers(message, location);
  }
}